

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnn2table.cpp
# Opt level: O2

int parse_images_dir(char *base_path,
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *file_path)

{
  DIR *__dirp;
  dirent *pdVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string path;
  
  __dirp = opendir(base_path);
  if (__dirp != (DIR *)0x0) {
    while( true ) {
      pdVar1 = readdir(__dirp);
      if (pdVar1 == (dirent *)0x0) break;
      if ((pdVar1->d_name[0] != '.') ||
         ((pdVar1->d_name[1] != '\0' && ((pdVar1->d_name[1] != '.' || (pdVar1->d_name[2] != '\0'))))
         )) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&path,base_path,(allocator<char> *)&local_70);
        std::operator+(&local_70,&path,pdVar1->d_name);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)file_path,
                   &local_70);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&path);
      }
    }
    closedir(__dirp);
    return 0;
  }
  perror("Open dir error...");
  exit(1);
}

Assistant:

int parse_images_dir(const char *base_path, std::vector<std::string>& file_path)
{
    DIR *dir;
    struct dirent *ptr;

    if ((dir=opendir(base_path)) == NULL)
    {
        perror("Open dir error...");
        exit(1);
    }

    while ((ptr=readdir(dir)) != NULL)
    {
        if(strcmp(ptr->d_name,".")==0 || strcmp(ptr->d_name,"..")==0)    ///current dir OR parrent dir
        {
            continue;
        } 

        std::string path = base_path;
        file_path.push_back(path + ptr->d_name);
    }
    closedir(dir);

    return 0;
}